

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# work_mgga_inc.c
# Opt level: O3

void work_mgga_vxc_unpol(xc_func_type *p,size_t np,double *rho,double *sigma,double *lapl,
                        double *tau,xc_mgga_out_params *out)

{
  uint uVar1;
  double *pdVar2;
  undefined1 auVar3 [16];
  long lVar4;
  size_t sVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  double dVar35;
  double dVar36;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  double dVar46;
  double dVar47;
  double dVar48;
  double dVar49;
  double dVar50;
  double dVar51;
  double dVar52;
  double dVar53;
  double dVar54;
  double dVar55;
  double dVar56;
  double dVar57;
  double dVar58;
  double dVar59;
  double dVar60;
  double dVar61;
  double dVar62;
  double dVar63;
  double dVar72;
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  double dVar73;
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  double dVar74;
  double dVar75;
  double dVar76;
  double dVar77;
  double dVar78;
  double dVar79;
  double dVar80;
  double dVar81;
  double dVar82;
  double dVar83;
  undefined1 auVar84 [16];
  double dVar94;
  undefined1 auVar85 [16];
  double dVar95;
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  double dVar96;
  double dVar97;
  double dVar98;
  double dVar99;
  double dVar100;
  double dVar101;
  double dVar102;
  double dVar103;
  double dVar104;
  double dVar105;
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  double dVar115;
  double dVar121;
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  double dVar116;
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  double dVar117;
  double dVar118;
  double dVar119;
  double dVar120;
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  double dVar136;
  double dVar137;
  double dVar138;
  double dVar139;
  double dVar140;
  double dVar141;
  double dVar142;
  double dVar143;
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  double dVar157;
  double dVar158;
  double dVar159;
  double dVar160;
  double dVar161;
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  double dVar179;
  double dVar180;
  double dVar181;
  double dVar182;
  double dVar183;
  double dVar184;
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  double dVar191;
  double dVar192;
  double dVar195;
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  double dVar196;
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  double dVar202;
  double dVar203;
  double dVar204;
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  double dVar208;
  double dVar209;
  undefined1 auVar210 [16];
  double dVar211;
  double dVar212;
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  double dVar215;
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  double dVar221;
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  double local_868;
  double local_860;
  double local_858;
  double local_798;
  double local_528;
  double dStack_520;
  double local_518;
  double dStack_510;
  double local_508;
  double dStack_500;
  double local_488;
  double dStack_480;
  undefined1 local_478 [336];
  undefined1 local_328 [16];
  double local_298;
  double local_288;
  double local_248;
  double dStack_240;
  
  if (np != 0) {
    sVar5 = 0;
    local_868 = 0.0;
    do {
      lVar4 = (long)(p->dim).rho * sVar5;
      dVar9 = rho[lVar4];
      if (p->nspin == 2) {
        dVar9 = dVar9 + rho[lVar4 + 1];
      }
      dVar83 = p->dens_threshold;
      if (dVar83 <= dVar9) {
        dVar9 = rho[lVar4];
        if (rho[lVar4] <= dVar83) {
          dVar9 = dVar83;
        }
        dVar10 = p->sigma_threshold * p->sigma_threshold;
        local_860 = sigma[(long)(p->dim).sigma * sVar5];
        if (sigma[(long)(p->dim).sigma * sVar5] <= dVar10) {
          local_860 = dVar10;
        }
        uVar1 = p->info->flags;
        if ((uVar1 >> 0x10 & 1) != 0) {
          local_868 = tau[(long)(p->dim).tau * sVar5];
          if (tau[(long)(p->dim).tau * sVar5] <= p->tau_threshold) {
            local_868 = p->tau_threshold;
          }
          if (((uVar1 >> 0x11 & 1) != 0) && (dVar10 = dVar9 * 8.0 * local_868, dVar10 <= local_860))
          {
            local_860 = dVar10;
          }
        }
        dVar10 = p->zeta_threshold;
        dVar143 = (double)(-(ulong)(dVar10 < 1.0) & 0x3ff0000000000000 |
                          ~-(ulong)(dVar10 < 1.0) & (ulong)(dVar10 + -1.0 + 1.0));
        uVar6 = -(ulong)(dVar143 <= dVar10);
        dVar10 = (double)(uVar6 & (ulong)dVar10 | ~uVar6 & (ulong)dVar143);
        dVar11 = cbrt(dVar10);
        dVar12 = cbrt(dVar9);
        dVar13 = (1.0 / dVar9) * local_860;
        dVar46 = 1.0 / local_868;
        dVar47 = dVar46 * dVar13 * 0.125;
        dVar143 = dVar47;
        if (1.0 <= dVar47) {
          dVar143 = 1.0;
        }
        dVar48 = dVar143 * dVar143;
        dVar74 = dVar143 * dVar48 + 1.0;
        dVar14 = cbrt(9.0);
        dVar15 = cbrt(0.3183098861837907);
        dVar15 = dVar15 * dVar15 * dVar14 * dVar14;
        dVar49 = p->cam_omega * dVar15;
        dVar14 = cbrt(9.869604401089358);
        auVar223._0_8_ = 1.0 / (dVar12 * dVar12);
        auVar111._0_8_ = dVar9 * dVar9;
        auVar111._8_8_ = dVar14 * dVar14;
        local_328._8_8_ = 0x3ff0000000000000;
        local_328._0_8_ = auVar223._0_8_;
        auVar223._8_8_ = 0x3ff0000000000000;
        auVar84 = divpd(auVar223,auVar111);
        dVar75 = auVar84._0_8_;
        dVar50 = local_860 * 1.5874010519681996 * dVar75;
        dVar94 = auVar84._8_8_;
        dVar72 = dVar94 * 1.8171205928321397;
        dVar51 = dVar50 * dVar72;
        dVar96 = ((1.0 / dVar14) / 9.869604401089358) * 3.3019272488946267;
        dVar115 = local_860 * local_860 * 1.2599210498948732;
        dVar136 = 1.0 / dVar12;
        dVar76 = dVar136 / (dVar9 * auVar111._0_8_ * auVar111._0_8_);
        dVar16 = dVar96 * 0.00537989809245259 * dVar115 * dVar76 + dVar51 * 0.1504548888888889 + 1.0
        ;
        dVar14 = pow(dVar16,0.1);
        auVar162._8_8_ = dVar14;
        auVar162._0_8_ = dVar11;
        auVar84 = divpd(_DAT_00f56e20,auVar162);
        dVar121 = auVar84._0_8_;
        dVar52 = dVar136 * 1.4422495703074083 * dVar49;
        dVar53 = (dVar52 * auVar84._8_8_ * dVar121) / 18.0;
        dVar14 = 1e-10;
        if (1e-10 <= dVar53) {
          dVar14 = dVar53;
        }
        dVar54 = 1.35;
        if (dVar14 <= 1.35) {
          dVar54 = dVar14;
        }
        dVar17 = 1.0 / dVar54;
        dVar18 = erf(dVar17 * 0.5);
        dVar55 = dVar54 * dVar54;
        dVar19 = exp((1.0 / dVar55) * -0.25);
        dVar141 = dVar14;
        if (dVar14 <= 1.35) {
          dVar141 = 1.35;
        }
        dVar179 = dVar141 * dVar141;
        dVar191 = dVar179 * dVar179;
        dVar77 = dVar191 * dVar191;
        auVar144._0_8_ = dVar77 * dVar77;
        auVar144._8_8_ = dVar77;
        auVar162 = divpd(_DAT_00f56e20,auVar144);
        dVar77 = dVar55 * -2.0 * (dVar19 + -1.0) + dVar19 + -1.5;
        dVar18 = (dVar54 + dVar54) * dVar77 + dVar18 * 1.7724538509055159;
        dVar184 = auVar162._8_8_;
        auVar127._8_8_ = dVar184;
        auVar127._0_8_ = dVar184;
        if (dVar14 < 1.35) {
          local_798 = dVar54 * -2.6666666666666665 * dVar18 + 1.0;
        }
        else {
          auVar122._0_8_ = dVar184 / (dVar179 * dVar191);
          auVar85._0_8_ = 1.0 / (dVar179 * dVar191);
          auVar106._8_8_ = dVar191;
          auVar106._0_8_ = dVar179;
          auVar144 = divpd(_DAT_00f56e20,auVar106);
          auVar145 = divpd(auVar144,_DAT_00f630b0);
          auVar85._8_8_ = dVar184;
          auVar85 = divpd(auVar85,_DAT_00f630c0);
          auVar144 = divpd(auVar127,auVar106);
          auVar106 = divpd(auVar144,_DAT_00f630d0);
          auVar122._8_8_ = auVar162._0_8_;
          auVar144 = divpd(auVar122,_DAT_00f630e0);
          local_798 = ((((((auVar145._0_8_ - auVar145._8_8_) + auVar85._0_8_) - auVar85._8_8_) +
                        auVar106._0_8_) - auVar106._8_8_) + auVar144._0_8_) - auVar144._8_8_;
        }
        dVar20 = dVar143 * dVar48 * 3.0 + dVar48;
        dVar21 = 1.0 / (dVar74 * dVar74);
        dVar22 = pow(dVar16,0.2);
        dVar23 = 0.27;
        if (dVar14 <= 0.27) {
          dVar23 = dVar14;
        }
        dVar56 = dVar23 * dVar23;
        dVar24 = exp((-1.0 / dVar56) * 0.25);
        dVar25 = erf((1.0 / dVar23) * 0.5);
        dVar142 = dVar14;
        if (dVar14 <= 0.27) {
          dVar142 = 0.27;
        }
        dVar202 = dVar142 * dVar142;
        dVar211 = dVar202 * dVar202;
        dVar208 = dVar211 * dVar211;
        dVar157 = dVar208 * dVar208;
        auVar145._8_8_ = dVar157 * dVar157;
        auVar145._0_8_ = dVar157;
        auVar144 = divpd(_DAT_00f56e20,auVar145);
        dVar97 = dVar56 * dVar56 * 64.0;
        dVar78 = dVar56 * 20.0 - dVar97;
        dVar97 = dVar56 * -36.0 + dVar23 * 17.724538509055158 * dVar25 + dVar78 * dVar24 + dVar97 +
                 -3.0;
        local_478._8_8_ = auVar144._0_8_;
        dVar195 = auVar144._8_8_;
        local_478._0_8_ = local_478._8_8_;
        if (dVar14 < 0.27) {
          dVar116 = dVar56 * 24.0 * dVar97 + 1.0;
        }
        else {
          auVar125._0_8_ = dVar208 * dVar202;
          auVar125._8_8_ = dVar157 * dVar202;
          auVar147._0_8_ = dVar211 * dVar208;
          auVar226._8_8_ = auVar147._0_8_;
          auVar226._0_8_ = dVar211;
          auVar147._8_8_ = auVar125._0_8_;
          auVar123._8_8_ = local_478._8_8_;
          auVar123._0_8_ = local_478._8_8_;
          auVar122 = divpd(auVar123,auVar147);
          auVar123 = divpd(auVar122,_DAT_00fc54e0);
          auVar163._8_8_ = dVar195 / auVar147._0_8_;
          auVar163._0_8_ = 0x3f55f15f15f15f16;
          auVar164._8_8_ = 0x47b9867eba1668be;
          auVar164._0_8_ = dVar211;
          auVar164 = divpd(auVar163,auVar164);
          auVar198._0_8_ = dVar202 * dVar211;
          auVar186._0_8_ = -(double)local_478._8_8_;
          auVar186._8_8_ = local_478._8_8_;
          auVar188._8_8_ = dVar208;
          auVar188._0_8_ = auVar198._0_8_;
          auVar122 = divpd(auVar186,auVar188);
          auVar106 = divpd(auVar122,_DAT_00fc54d0);
          dVar116 = dVar208 * auVar198._0_8_;
          auVar185._8_8_ = (double)local_478._8_8_ / dVar116;
          auVar185._0_8_ = dVar195;
          auVar186 = divpd(auVar185,_DAT_00fc54f0);
          auVar218._8_8_ = 0x3ff0000000000000;
          auVar218._0_8_ = dVar195;
          auVar165._8_8_ = auVar125._0_8_;
          auVar165._0_8_ = dVar202;
          auVar187._8_8_ = 0x3ff0000000000000;
          auVar187._0_8_ = dVar195;
          auVar122 = divpd(auVar187,auVar165);
          auVar188 = divpd(auVar122,_DAT_00fc5510);
          auVar146._8_8_ = 0x3ff0000000000000;
          auVar146._0_8_ = dVar195;
          auVar122 = divpd(auVar146,auVar226);
          auVar147 = divpd(auVar122,_DAT_00fc5520);
          auVar198._8_8_ = dVar116;
          auVar107._8_8_ = 0x3ff0000000000000;
          auVar107._0_8_ = dVar195;
          auVar122 = divpd(auVar107,auVar198);
          auVar145 = divpd(auVar122,_DAT_00fc5530);
          auVar206._0_8_ = dVar195 / dVar208;
          auVar206._8_8_ = local_478._8_8_;
          auVar122 = divpd(auVar206,_DAT_00fc5540);
          auVar85 = divpd(auVar218,auVar125);
          auVar85 = divpd(auVar85,_DAT_00fc5550);
          dVar116 = auVar85._8_8_ +
                    auVar122._8_8_ +
                    auVar145._8_8_ +
                    auVar147._8_8_ +
                    auVar188._8_8_ +
                    (1.0 / dVar208) * 3.804788961038961e-06 +
                    (1.0 / auVar198._0_8_) / -11520.0 +
                    auVar164._8_8_ + (dVar195 / dVar116) / -3.511556992918352e+39 + auVar164._0_8_ +
                    ((double)local_478._8_8_ / dVar211) / 927028425523200.0 +
                    auVar85._0_8_ +
                    auVar122._0_8_ +
                    auVar145._0_8_ +
                    auVar147._0_8_ +
                    auVar188._0_8_ +
                    ((((auVar106._8_8_ + auVar106._0_8_) - auVar123._8_8_) + auVar123._0_8_) -
                    auVar186._8_8_) + auVar186._0_8_;
        }
        dVar11 = dVar11 * dVar10;
        dVar79 = dVar20 * dVar21;
        dVar80 = 1.0 / dVar22;
        auVar37._8_8_ = dVar22 * dVar22;
        auVar37._0_8_ = dVar9;
        auVar122 = divpd(local_328,auVar37);
        dVar81 = auVar122._0_8_;
        dVar98 = local_868 * 1.5874010519681996 * dVar81;
        dVar99 = dVar98 * 0.14554132;
        dVar100 = dVar50 * 0.04229627833333333 +
                  (auVar111._8_8_ * 3.3019272488946267 * 0.043662396 - dVar99);
        dVar95 = auVar122._8_8_;
        dVar22 = dVar95 * dVar72;
        dVar10 = 0.32;
        if (dVar14 <= 0.32) {
          dVar10 = dVar14;
        }
        dVar82 = dVar10 * dVar10;
        dVar26 = 1.0 / dVar82;
        dVar27 = exp(dVar26 * -0.25);
        dVar28 = erf((1.0 / dVar10) * 0.5);
        dVar204 = dVar14;
        if (dVar14 <= 0.32) {
          dVar204 = 0.32;
        }
        dVar209 = dVar204 * dVar204;
        dVar212 = dVar209 * dVar209;
        dVar215 = dVar212 * dVar212;
        dVar57 = dVar215 * dVar215;
        dVar137 = 1.0 / dVar57;
        auVar229._0_8_ = 1.0 / (dVar57 * dVar57);
        dVar203 = dVar10 * dVar82;
        dVar196 = dVar82 * dVar82;
        dVar180 = dVar10 * dVar196;
        dVar58 = dVar196 * dVar196;
        dVar221 = dVar10 * dVar58 * -122880.0 +
                  dVar196 * dVar203 * 3840.0 + dVar180 * -576.0 + dVar10 * -8.0 + dVar203 * 256.0;
        dVar181 = dVar82 * dVar196;
        dVar182 = dVar181 * 5120.0 + dVar196 * -1440.0 + dVar82 * 224.0 + -35.0;
        dVar158 = dVar82 * 60.0 + -2.0;
        dVar59 = dVar203 * 24.0;
        dVar57 = dVar221 * dVar27 + dVar158 * 3.5449077018110318 * dVar28 + dVar59 * dVar182;
        if (dVar14 < 0.32) {
          dVar101 = dVar10 * 1.1428571428571428 * dVar57 + 1.0;
        }
        else {
          dVar101 = dVar209 * dVar212;
          auVar86._8_8_ = dVar137 / dVar209;
          auVar86._0_8_ = dVar137;
          auVar64._8_8_ = dVar137;
          auVar64._0_8_ = dVar137;
          auVar38._8_8_ = dVar101;
          auVar38._0_8_ = dVar212;
          auVar108._8_8_ = dVar137;
          auVar108._0_8_ = dVar137;
          auVar148._8_8_ = dVar209 * dVar215;
          auVar148._0_8_ = dVar215;
          auVar124._8_8_ = dVar137;
          auVar124._0_8_ = dVar137;
          auVar125 = divpd(auVar124,auVar148);
          auVar166._0_8_ = dVar215 * dVar212;
          auVar166._8_8_ = dVar215 * dVar101;
          auVar122 = divpd(auVar64,auVar166);
          auVar106 = divpd(auVar86,_DAT_00fc5560);
          auVar85 = divpd(auVar108,auVar38);
          auVar145 = divpd(auVar85,_DAT_00fc5570);
          auVar125 = divpd(auVar125,_DAT_00fc5580);
          auVar122 = divpd(auVar122,_DAT_00fc5590);
          auVar87._8_8_ = auVar229._0_8_ / dVar209;
          auVar87._0_8_ = auVar229._0_8_;
          auVar85 = divpd(auVar87,_DAT_00fc55a0);
          auVar229._8_8_ = auVar229._0_8_;
          auVar147 = divpd(auVar229,auVar38);
          auVar147 = divpd(auVar147,_DAT_00fc55b0);
          dVar101 = ((((((((((((1.0 / auVar166._8_8_) / -115811942400.0 +
                               (1.0 / auVar166._0_8_) / 2530344960.0 +
                               (1.0 / (dVar209 * dVar215)) / -61501440.0 +
                               (1.0 / dVar215) * 5.871587902837903e-07 +
                               (1.0 / dVar101) / -56448.0 + 0.0003826530612244898 / dVar212 +
                              auVar106._0_8_) - auVar106._8_8_) + auVar145._0_8_) - auVar145._8_8_)
                          + auVar125._0_8_) - auVar125._8_8_) + auVar122._0_8_) - auVar122._8_8_) +
                      auVar85._0_8_) - auVar85._8_8_) + auVar147._0_8_) - auVar147._8_8_;
        }
        dVar29 = dVar9 * 0.5;
        dVar138 = dVar94 * dVar101 * 1.8171205928321397;
        dVar117 = dVar50 * dVar95;
        dVar30 = dVar138 * 0.026329605555555555;
        dVar31 = dVar30 * dVar117 +
                 local_798 * dVar80 + dVar100 * dVar116 * 0.43209876543209874 * dVar22;
        dVar32 = 1.0 - dVar79;
        dVar33 = (dVar52 * dVar121) / 18.0;
        dVar52 = 1.35;
        if (dVar33 <= 1.35) {
          dVar52 = dVar33;
        }
        dVar34 = erf((1.0 / dVar52) * 0.5);
        dVar60 = dVar52 * dVar52;
        dVar35 = exp((1.0 / dVar60) * -0.25);
        dVar102 = dVar33;
        if (dVar33 <= 1.35) {
          dVar102 = 1.35;
        }
        dVar192 = dVar102 * dVar102;
        dVar183 = dVar192 * dVar192;
        dVar103 = dVar183 * dVar183;
        auVar65._0_8_ = dVar103 * dVar103;
        auVar65._8_8_ = dVar103;
        auVar122 = divpd(_DAT_00f56e20,auVar65);
        dVar159 = dVar60 * -2.0 * (dVar35 + -1.0) + dVar35 + -1.5;
        dVar34 = dVar34 * 1.7724538509055159 + (dVar52 + dVar52) * dVar159;
        dVar103 = auVar122._8_8_;
        if (dVar33 < 1.35) {
          dVar118 = dVar52 * -2.6666666666666665 * dVar34 + 1.0;
        }
        else {
          auVar39._0_8_ = dVar103 / (dVar192 * dVar183);
          auVar88._0_8_ = 1.0 / (dVar192 * dVar183);
          auVar66._8_8_ = dVar183;
          auVar66._0_8_ = dVar192;
          auVar106 = divpd(_DAT_00f56e20,auVar66);
          auVar125 = divpd(auVar106,_DAT_00f630b0);
          auVar88._8_8_ = dVar103;
          auVar85 = divpd(auVar88,_DAT_00f630c0);
          auVar109._8_8_ = dVar103;
          auVar109._0_8_ = dVar103;
          auVar106 = divpd(auVar109,auVar66);
          auVar145 = divpd(auVar106,_DAT_00f630d0);
          auVar39._8_8_ = auVar122._0_8_;
          auVar106 = divpd(auVar39,_DAT_00f630e0);
          dVar118 = ((((((auVar125._0_8_ - auVar125._8_8_) + auVar85._0_8_) - auVar85._8_8_) +
                      auVar145._0_8_) - auVar145._8_8_) + auVar106._0_8_) - auVar106._8_8_;
        }
        dVar104 = (dVar51 * 0.0028577960676726107 + 0.12345679012345678) * 1.8171205928321397;
        dVar160 = dVar94 * dVar104;
        dVar139 = dVar51 / 36.0 +
                  (dVar98 + dVar50 * -0.125) * 1.8171205928321397 * dVar94 * 0.25 + -0.45;
        dVar140 = 1.0 - dVar143;
        dVar105 = dVar143 * dVar139 * 1.0814814814814815;
        dVar61 = dVar32 * dVar118;
        dVar98 = pow((dVar139 * dVar139 * 0.7209876543209877 +
                     dVar160 * 0.4166666666666667 * dVar50 + 1.0) - dVar105 * dVar140,0.1);
        dVar119 = (dVar50 * 0.011867481666666667 +
                  auVar111._8_8_ * 3.3019272488946267 * 0.256337604 + dVar99) * 0.5555555555555556 *
                  -1.8171205928321397 * dVar94 + dVar51 * 0.06394332777777778 + 1.0;
        dVar120 = dVar119 * 0.7777777777777778 * dVar95 + dVar80;
        dVar99 = dVar32 * dVar98 +
                 (dVar79 * dVar120 - (dVar79 * dVar31 + dVar61 * dVar98) * p->cam_beta);
        dVar50 = dVar12 * dVar11 * -0.36927938319101117;
        dVar51 = dVar50 * dVar99;
        dVar51 = (double)(~-(ulong)(dVar29 <= dVar83) & (ulong)(dVar51 + dVar51));
        pdVar2 = out->zk;
        if ((pdVar2 != (double *)0x0) && ((p->info->flags & 1) != 0)) {
          lVar4 = (long)(p->dim).zk * sVar5;
          pdVar2[lVar4] = pdVar2[lVar4] + dVar51;
        }
        local_858 = 0.0;
        dVar161 = 0.0;
        if (dVar47 < 1.0) {
          dVar161 = (1.0 / auVar111._0_8_) * local_860 * dVar46 * -0.125;
        }
        auVar84._0_8_ = dVar136;
        auVar67._8_8_ = dVar16;
        auVar67._0_8_ = dVar9;
        auVar106 = divpd(auVar84,auVar67);
        dVar15 = dVar15 * p->cam_omega * 1.4422495703074083;
        dVar62 = auVar106._0_8_ * 1.4422495703074083;
        dVar73 = dVar136 * auVar106._8_8_;
        dVar36 = local_860 * 1.5874010519681996 * (auVar223._0_8_ / (dVar9 * auVar111._0_8_));
        dVar63 = dVar36 * dVar72;
        dVar115 = dVar115 * dVar96 * (dVar136 / (auVar111._0_8_ * auVar111._0_8_ * auVar111._0_8_));
        dVar136 = dVar63 * -0.40121303703703703 + dVar115 * -0.028692789826413812;
        dVar179 = dVar179 * dVar141;
        if (1e-10 <= dVar53) {
          auVar89._0_8_ = auVar84._8_8_ * dVar121 * -dVar49 * dVar62;
          auVar89._8_8_ = dVar121 * dVar136 * dVar15 * dVar73;
          auVar84 = divpd(auVar89,_DAT_00fc55e0);
          local_858 = auVar84._0_8_ - auVar84._8_8_;
        }
        auVar40._0_8_ = dVar141 * dVar191;
        auVar213._8_8_ = dVar191 * dVar179;
        auVar213._0_8_ = dVar141;
        auVar40._8_8_ = dVar179;
        auVar84 = divpd(auVar127,auVar40);
        auVar222._8_8_ = 0x3ff0000000000000;
        auVar222._0_8_ = dVar184;
        auVar223 = divpd(auVar222,auVar213);
        auVar162 = divpd(auVar162,auVar213);
        dVar184 = (1.0 / dVar55) * dVar19;
        dVar55 = 1.0 / (dVar55 * dVar54);
        dVar141 = (dVar19 + -1.0) * dVar54 * -4.0;
        uVar6 = -(ulong)(1.35 < dVar14);
        if (dVar14 < 1.35) {
          dVar191 = (double)(~uVar6 & (ulong)local_858);
          local_288 = dVar191 * -2.6666666666666665 * dVar18 +
                      dVar54 * -2.6666666666666665 *
                      (((dVar54 + dVar54) *
                        ((dVar141 * dVar191 + dVar55 * dVar191 * dVar19 * 0.5) -
                        dVar191 * dVar17 * dVar19) + (dVar77 + dVar77) * dVar191) -
                      dVar191 * dVar184);
        }
        else {
          dVar191 = (double)(uVar6 & (ulong)local_858);
          auVar230._0_8_ = -(1.0 / dVar179) * dVar191;
          auVar230._8_8_ = (1.0 / auVar40._0_8_) * dVar191;
          auVar85 = divpd(auVar230,_DAT_00f630f0);
          auVar110._0_8_ = auVar223._0_8_ * dVar191;
          auVar110._8_8_ = auVar223._8_8_ * dVar191;
          auVar111 = divpd(auVar110,_DAT_00f63100);
          auVar167._0_8_ = auVar84._0_8_ * dVar191;
          auVar167._8_8_ = auVar84._8_8_ * dVar191;
          auVar106 = divpd(auVar167,_DAT_00f63110);
          auVar126._0_8_ = dVar191 * auVar162._0_8_;
          auVar126._8_8_ = dVar191 * auVar162._8_8_;
          auVar127 = divpd(auVar126,_DAT_00f63120);
          local_288 = ((((((auVar85._8_8_ + auVar85._0_8_) - auVar111._8_8_) + auVar111._0_8_) -
                        auVar106._8_8_) + auVar106._0_8_) - auVar127._8_8_) + auVar127._0_8_;
        }
        auVar149._0_8_ = dVar157 * dVar142;
        auVar149._8_8_ = dVar211 * dVar142;
        auVar68._0_8_ = dVar208 * auVar149._8_8_;
        dVar202 = dVar202 * dVar142;
        auVar41._0_8_ = dVar202 * dVar211;
        auVar41._8_8_ = dVar142 * dVar208;
        auVar112._8_8_ = auVar41._0_8_;
        auVar112._0_8_ = dVar202;
        auVar168._0_8_ = dVar208 * dVar202;
        auVar168._8_8_ = dVar208 * auVar41._0_8_;
        auVar128._8_8_ = auVar68._0_8_;
        auVar128._0_8_ = auVar168._0_8_;
        auVar106 = divpd(local_478._0_16_,auVar128);
        auVar90._8_8_ = dVar195;
        auVar90._0_8_ = 0x3ff0000000000000;
        auVar68._8_8_ = dVar142;
        auVar129._8_8_ = dVar195;
        auVar129._0_8_ = 0x3ff0000000000000;
        auVar145 = divpd(auVar129,auVar68);
        auVar216._8_8_ = local_478._8_8_;
        auVar216._0_8_ = 0x3ff0000000000000;
        auVar147 = divpd(auVar216,auVar168);
        auVar169._8_8_ = dVar202;
        auVar169._0_8_ = auVar168._8_8_;
        auVar69._8_8_ = dVar195;
        auVar69._0_8_ = 0x3ff0000000000000;
        auVar111 = divpd(auVar69,auVar169);
        auVar127 = divpd(auVar144,auVar112);
        dVar157 = (1.0 / auVar149._8_8_) * -0.005357142857142857;
        auVar125 = divpd(local_478._0_16_,auVar41);
        auVar85 = divpd(auVar90,auVar149);
        auVar42._8_8_ = auVar41._8_8_;
        auVar42._0_8_ = auVar149._8_8_;
        auVar144 = divpd(auVar144,auVar42);
        dVar97 = dVar97 * dVar23;
        dVar191 = dVar23 * dVar56 * 256.0;
        dVar78 = (1.0 / (dVar23 * dVar56)) * dVar78;
        dVar142 = (1.0 / dVar23) * dVar24 * -10.0;
        uVar7 = -(ulong)(0.27 < dVar14);
        local_478._0_8_ = auVar106._0_8_;
        local_478._8_8_ = auVar106._8_8_;
        local_518 = auVar145._0_8_;
        dStack_510 = auVar145._8_8_;
        local_528 = auVar111._0_8_;
        dStack_520 = auVar111._8_8_;
        local_508 = auVar127._0_8_;
        dStack_500 = auVar127._8_8_;
        if (dVar14 < 0.27) {
          dVar202 = (double)(~uVar7 & (ulong)local_858);
          dVar208 = dVar191 * dVar202;
          local_298 = dVar97 * 48.0 * dVar202 +
                      dVar56 * 24.0 *
                      (dVar142 * dVar202 +
                      dVar202 * 10.0 * 1.7724538509055159 * dVar25 +
                      dVar23 * dVar202 * -72.0 +
                      (dVar23 * dVar202 * 40.0 - dVar208) * dVar24 + dVar24 * dVar202 * dVar78 * 0.5
                      + dVar208);
        }
        else {
          dVar202 = (double)(uVar7 & (ulong)local_858);
          auVar197._0_8_ = auVar125._0_8_ * dVar202;
          auVar197._8_8_ = auVar125._8_8_ * dVar202;
          auVar198 = divpd(auVar197,_DAT_00fc55f0);
          auVar205._0_8_ = (double)local_478._0_8_ * dVar202;
          auVar205._8_8_ = (double)local_478._8_8_ * dVar202;
          auVar206 = divpd(auVar205,_DAT_00fc5600);
          auVar207._0_8_ = -(dVar195 / auVar68._0_8_) * dVar202;
          auVar207._8_8_ = (dVar195 / auVar168._8_8_) * dVar202;
          auVar186 = divpd(auVar207,_DAT_00fc5610);
          auVar217._0_8_ = auVar147._0_8_ * dVar202;
          auVar217._8_8_ = auVar147._8_8_ * dVar202;
          auVar218 = divpd(auVar217,_DAT_00fc5620);
          auVar70._0_8_ = local_518 * dVar202;
          auVar70._8_8_ = dStack_510 * dVar202;
          auVar111 = divpd(auVar70,_DAT_00fc5630);
          auVar189._0_8_ = local_528 * dVar202;
          auVar189._8_8_ = dStack_520 * dVar202;
          auVar145 = divpd(auVar189,_DAT_00fc5640);
          auVar91._0_8_ = auVar85._0_8_ * dVar202;
          auVar91._8_8_ = auVar85._8_8_ * dVar202;
          auVar127 = divpd(auVar91,_DAT_00fc5650);
          auVar190._0_8_ = local_508 * dVar202;
          auVar190._8_8_ = dStack_500 * dVar202;
          auVar164 = divpd(auVar190,_DAT_00fc5660);
          auVar113._0_8_ = dVar202 * auVar144._0_8_;
          auVar113._8_8_ = dVar202 * auVar144._8_8_;
          auVar106 = divpd(auVar113,_DAT_00fc5670);
          local_298 = auVar106._8_8_ +
                      auVar164._8_8_ +
                      auVar127._8_8_ +
                      auVar145._8_8_ +
                      auVar111._8_8_ +
                      auVar218._8_8_ +
                      (((auVar198._0_8_ - auVar198._8_8_) + auVar206._0_8_) - auVar206._8_8_) +
                      ((dVar195 / auVar168._0_8_) * dVar202) / 8.121312287389663e+33 +
                      auVar106._0_8_ +
                      auVar164._0_8_ +
                      auVar127._0_8_ +
                      auVar145._0_8_ +
                      auVar111._0_8_ +
                      auVar218._0_8_ +
                      (1.0 / auVar41._8_8_) * -3.0438311688311688e-05 * dVar202 +
                      ((1.0 / auVar41._0_8_) * dVar202) / 1920.0 +
                      dVar157 * dVar202 + auVar186._8_8_ + auVar186._0_8_;
        }
        local_798 = local_798 * (dVar80 / dVar16);
        dVar202 = local_868 * 1.5874010519681996 * dVar75;
        dVar208 = dVar202 * 0.24256886666666666;
        auVar130._0_8_ = dVar209 * dVar204;
        auVar130._8_8_ = dVar204;
        auVar150._0_8_ = dVar212 * auVar130._0_8_;
        auVar150._8_8_ = dVar212 * dVar204;
        auVar43._0_8_ = auVar130._0_8_ * dVar215;
        auVar43._8_8_ = dVar204 * dVar215;
        auVar219._8_8_ = dVar137;
        auVar219._0_8_ = dVar137;
        auVar92._8_8_ = dVar137;
        auVar92._0_8_ = dVar137;
        auVar106 = divpd(auVar92,auVar43);
        auVar170._0_8_ = dVar215 * auVar150._0_8_;
        auVar170._8_8_ = dVar215 * auVar150._8_8_;
        auVar44._8_8_ = dVar137;
        auVar44._0_8_ = dVar137;
        auVar111 = divpd(auVar44,auVar130);
        auVar224._8_8_ = dVar137;
        auVar224._0_8_ = dVar137;
        auVar198 = divpd(auVar224,auVar150);
        auVar164 = divpd(auVar219,auVar170);
        auVar45._8_8_ = auVar229._0_8_;
        auVar45._0_8_ = auVar229._0_8_;
        auVar171._8_8_ = auVar229._0_8_;
        auVar171._0_8_ = auVar229._0_8_;
        auVar145 = divpd(auVar171,auVar130);
        auVar127 = divpd(auVar45,auVar150);
        dVar204 = (1.0 / auVar150._8_8_) * -0.001530612244897959;
        dVar221 = (1.0 / dVar203) * dVar221;
        dVar158 = dVar158 * dVar27;
        dVar137 = dVar182 * dVar82 * 72.0;
        dVar211 = dVar10 * 1.7724538509055159 * 240.0;
        dVar158 = dVar158 + dVar158;
        uVar8 = -(ulong)(0.32 < dVar14);
        local_248 = auVar111._0_8_;
        dStack_240 = auVar111._8_8_;
        local_488 = auVar127._0_8_;
        dStack_480 = auVar127._8_8_;
        if (dVar14 < 0.32) {
          local_858 = (double)(~uVar8 & (ulong)local_858);
          dVar182 = local_858 * 1.1428571428571428 * dVar57 +
                    dVar10 * 1.1428571428571428 *
                    ((dVar211 * local_858 * dVar28 +
                     (dVar180 * local_858 * 30720.0 +
                     dVar10 * local_858 * 448.0 + dVar203 * local_858 * -5760.0) * dVar59 +
                     dVar137 * local_858 +
                     (dVar196 * local_858 * -2880.0 +
                     dVar82 * local_858 * 768.0 +
                     local_858 * -8.0 +
                     dVar58 * -1105920.0 * local_858 + dVar181 * 26880.0 * local_858) * dVar27 +
                     dVar27 * local_858 * dVar221 * 0.5) - dVar26 * local_858 * dVar158);
        }
        else {
          local_858 = (double)((ulong)local_858 & uVar8);
          auVar114._0_8_ = local_248 * local_858;
          auVar114._8_8_ = dStack_240 * local_858;
          auVar127 = divpd(auVar114,_DAT_00fc5680);
          auVar225._0_8_ = auVar198._0_8_ * local_858;
          auVar225._8_8_ = auVar198._8_8_ * local_858;
          auVar226 = divpd(auVar225,_DAT_00fc5690);
          auVar93._0_8_ = auVar106._0_8_ * local_858;
          auVar93._8_8_ = auVar106._8_8_ * local_858;
          auVar111 = divpd(auVar93,_DAT_00fc56a0);
          auVar220._0_8_ = auVar164._0_8_ * local_858;
          auVar220._8_8_ = auVar164._8_8_ * local_858;
          auVar218 = divpd(auVar220,_DAT_00fc56b0);
          auVar172._0_8_ = auVar145._0_8_ * local_858;
          auVar172._8_8_ = auVar145._8_8_ * local_858;
          auVar186 = divpd(auVar172,_DAT_00fc56c0);
          auVar131._0_8_ = local_858 * local_488;
          auVar131._8_8_ = local_858 * dStack_480;
          auVar206 = divpd(auVar131,_DAT_00fc56d0);
          dVar182 = (((((((((((((local_858 * (1.0 / auVar170._0_8_)) / 8272281600.0 +
                               ((1.0 / auVar170._8_8_) * local_858) / -210862080.0 +
                               ((1.0 / auVar43._0_8_) * local_858) / 6150144.0 +
                               (1.0 / auVar43._8_8_) * -4.6972703222703225e-06 * local_858 +
                               dVar204 * local_858 + ((1.0 / auVar150._0_8_) * local_858) / 9408.0)
                              - auVar127._8_8_) + auVar127._0_8_) - auVar226._8_8_) + auVar226._0_8_
                           ) - auVar111._8_8_) + auVar111._0_8_) - auVar218._8_8_) + auVar218._0_8_)
                      - auVar186._8_8_) + auVar186._0_8_) - auVar206._8_8_) + auVar206._0_8_;
        }
        dVar209 = dVar95 / dVar16;
        dVar20 = dVar20 * (dVar21 / dVar74);
        dVar74 = dVar75 * 1.5874010519681996;
        dVar215 = dVar100 * dVar116 * 1.8171205928321397 * -0.1728395061728395;
        dVar212 = local_860 * dVar94 * dVar101 * 1.8171205928321397 * -0.010531842222222223;
        dVar49 = (dVar49 * dVar62 * dVar121) / -54.0;
        if (dVar33 < 1.35) {
          dVar49 = (double)(~-(ulong)(1.35 < dVar33) & (ulong)dVar49);
          dVar52 = dVar52 * -2.6666666666666665 *
                   (((dVar52 + dVar52) *
                     (((dVar35 + -1.0) * dVar52 * -4.0 * dVar49 +
                      (1.0 / (dVar60 * dVar52)) * dVar49 * dVar35 * 0.5) -
                     (1.0 / dVar52) * dVar49 * dVar35) + (dVar159 + dVar159) * dVar49) -
                   (1.0 / dVar60) * dVar35 * dVar49);
          dVar34 = dVar49 * -2.6666666666666665 * dVar34;
        }
        else {
          auVar227._0_8_ = dVar183 * dVar102;
          auVar227._8_8_ = dVar192 * dVar102;
          auVar111 = divpd(_DAT_00f56e20,auVar227);
          auVar3._8_8_ = dVar103;
          auVar3._0_8_ = dVar103;
          auVar186 = divpd(auVar3,auVar227);
          dVar49 = (double)(-(ulong)(1.35 < dVar33) & (ulong)dVar49);
          auVar193._0_8_ = auVar111._0_8_ * dVar49;
          auVar193._8_8_ = auVar111._8_8_ * dVar49;
          auVar206 = divpd(auVar193,_DAT_00f6b2b0);
          auVar151._8_8_ = 0x3ff0000000000000;
          auVar151._0_8_ = dVar103;
          auVar173._8_8_ = auVar227._8_8_ * dVar183;
          auVar173._0_8_ = dVar102;
          auVar111 = divpd(auVar151,auVar173);
          auVar152._0_8_ = auVar111._0_8_ * dVar49;
          auVar152._8_8_ = auVar111._8_8_ * dVar49;
          auVar127 = divpd(auVar152,_DAT_00f63100);
          auVar210._0_8_ = auVar186._0_8_ * dVar49;
          auVar210._8_8_ = auVar186._8_8_ * dVar49;
          auVar186 = divpd(auVar210,_DAT_00f63110);
          auVar111 = divpd(auVar122,auVar173);
          auVar132._0_8_ = auVar111._0_8_ * dVar49;
          auVar132._8_8_ = auVar111._8_8_ * dVar49;
          auVar111 = divpd(auVar132,_DAT_00f63120);
          dVar52 = auVar111._0_8_;
          dVar34 = (((((auVar206._0_8_ - auVar206._8_8_) - auVar127._8_8_) + auVar127._0_8_) -
                    auVar186._8_8_) + auVar186._0_8_) - auVar111._8_8_;
        }
        dVar49 = dVar48 * dVar31;
        dVar101 = dVar98 * dVar98 * dVar98 * dVar98;
        dVar33 = 1.0 / (dVar101 * dVar101 * dVar98);
        dVar103 = dVar48 * dVar120;
        dVar60 = -(dVar80 / dVar16);
        dVar102 = dVar119 * dVar209 * -0.3111111111111111;
        dVar16 = dVar32 * dVar33;
        dVar101 = -(dVar20 * 6.0);
        dVar35 = 0.0;
        if (dVar83 < dVar29) {
          dVar35 = (dVar143 * dVar161 + dVar143 * dVar161 + dVar48 * dVar161 * 9.0) * dVar21;
          dVar159 = dVar48 * dVar161 * 6.0 * dVar20 - dVar35;
          dVar202 = dVar63 * -0.07407407407407407 +
                    (dVar202 * -1.6666666666666667 + dVar36 / 3.0) * 1.8171205928321397 * dVar94 *
                    0.25;
          dVar115 = dVar161 * dVar105 +
                    dVar139 * -1.0814814814814815 * dVar161 * dVar140 +
                    dVar143 * dVar202 * -1.0814814814814815 * dVar140 +
                    dVar139 * 1.4419753086419753 * dVar202 +
                    dVar115 * -0.006350657928161358 + dVar160 * -1.1111111111111112 * dVar36;
          dVar35 = ((dVar115 * dVar16) / 10.0 +
                   dVar159 * dVar98 +
                   ((dVar63 * -0.17051554074074074 +
                    (dVar36 * -0.031646617777777775 - dVar208) * 0.5555555555555556 *
                    -1.8171205928321397 * dVar94) * 0.7777777777777778 * dVar95 +
                    (dVar136 * dVar60) / 5.0 + dVar102 * dVar136) * dVar79 +
                   dVar103 * dVar161 * dVar101 +
                   (dVar35 * dVar120 -
                   ((dVar33 * dVar115 * dVar61) / 10.0 +
                   dVar32 * (dVar34 + dVar52) * dVar98 +
                   dVar118 * dVar159 * dVar98 +
                   (dVar136 * dVar209 * dVar74 * dVar212 +
                   dVar182 * 1.8171205928321397 * dVar94 * 0.026329605555555555 * dVar117 +
                   dVar136 * dVar94 * dVar209 * dVar215 +
                   (dVar36 * -0.11279007555555555 + dVar208) * dVar116 * 0.43209876543209874 *
                   dVar22 + local_298 * dVar100 * 0.43209876543209874 * dVar22 +
                            local_288 * dVar80 + (dVar136 * local_798) / -5.0 +
                   dVar138 * -0.07021228148148148 * dVar36 * dVar95) * dVar79 +
                   dVar35 * dVar31 + dVar49 * dVar161 * dVar101) * p->cam_beta)) * dVar50 +
                   (dVar11 / (dVar12 * dVar12)) * -0.9847450218426964 * dVar99 * 0.125;
        }
        dVar11 = dVar9 + dVar9;
        pdVar2 = out->vrho;
        if ((pdVar2 != (double *)0x0) && ((p->info->flags & 2) != 0)) {
          lVar4 = (long)(p->dim).vrho * sVar5;
          pdVar2[lVar4] = dVar35 * dVar11 + dVar51 + pdVar2[lVar4];
        }
        dVar12 = (double)(-(ulong)(dVar47 < 1.0) & (ulong)((1.0 / dVar9) * dVar46 * 0.125));
        dVar76 = dVar76 * local_860 * 1.2599210498948732 * dVar96;
        dVar46 = dVar72 * 0.1504548888888889 * dVar74 + dVar76 * 0.01075979618490518;
        dVar9 = 0.0;
        if (1e-10 <= dVar53) {
          dVar9 = (dVar73 * dVar15 * dVar121 * dVar46) / -180.0;
        }
        if (dVar14 < 1.35) {
          dVar121 = (double)(~uVar6 & (ulong)dVar9);
          dVar15 = (dVar141 * dVar121 + dVar55 * dVar121 * dVar19 * 0.5) - dVar17 * dVar121 * dVar19
          ;
          dVar15 = dVar54 * -2.6666666666666665 *
                   ((dVar15 + dVar15) * dVar54 + ((dVar121 + dVar121) * dVar77 - dVar184 * dVar121))
          ;
          dVar18 = dVar121 * -2.6666666666666665 * dVar18;
        }
        else {
          dVar15 = (double)(uVar6 & (ulong)dVar9);
          auVar174._0_8_ = -(1.0 / dVar179) * dVar15;
          auVar174._8_8_ = (1.0 / auVar40._0_8_) * dVar15;
          auVar111 = divpd(auVar174,_DAT_00f630f0);
          auVar153._0_8_ = auVar223._0_8_ * dVar15;
          auVar153._8_8_ = auVar223._8_8_ * dVar15;
          auVar223 = divpd(auVar153,_DAT_00f63100);
          auVar199._0_8_ = auVar84._0_8_ * dVar15;
          auVar199._8_8_ = auVar84._8_8_ * dVar15;
          auVar127 = divpd(auVar199,_DAT_00f63110);
          auVar194._0_8_ = auVar162._0_8_ * dVar15;
          auVar194._8_8_ = auVar162._8_8_ * dVar15;
          auVar84 = divpd(auVar194,_DAT_00f63120);
          dVar15 = auVar84._0_8_;
          dVar18 = (((((auVar111._8_8_ + auVar111._0_8_) - auVar223._8_8_) + auVar223._0_8_) -
                    auVar127._8_8_) + auVar127._0_8_) - auVar84._8_8_;
        }
        if (dVar14 < 0.27) {
          dVar121 = (double)(~uVar7 & (ulong)dVar9);
          dVar191 = dVar191 * dVar121;
          dVar56 = dVar56 * (dVar142 * dVar121 +
                            dVar121 * 10.0 * 1.7724538509055159 * dVar25 +
                            dVar23 * dVar121 * -72.0 +
                            dVar78 * dVar24 * dVar121 * 0.5 +
                            (dVar23 * dVar121 * 40.0 - dVar191) * dVar24 + dVar191) * 24.0;
          dVar97 = dVar121 * 48.0 * dVar97;
        }
        else {
          dVar121 = (double)(uVar7 & (ulong)dVar9);
          auVar214._0_8_ = auVar125._0_8_ * dVar121;
          auVar214._8_8_ = auVar125._8_8_ * dVar121;
          auVar125 = divpd(auVar214,_DAT_00fc55f0);
          auVar175._0_8_ = (double)local_478._0_8_ * dVar121;
          auVar175._8_8_ = (double)local_478._8_8_ * dVar121;
          auVar223 = divpd(auVar175,_DAT_00fc5600);
          auVar228._0_8_ = -(dVar195 / auVar68._0_8_) * dVar121;
          auVar228._8_8_ = (dVar195 / auVar168._8_8_) * dVar121;
          auVar206 = divpd(auVar228,_DAT_00fc5610);
          auVar176._0_8_ = auVar147._0_8_ * dVar121;
          auVar176._8_8_ = auVar147._8_8_ * dVar121;
          auVar111 = divpd(auVar176,_DAT_00fc5620);
          auVar154._0_8_ = local_518 * dVar121;
          auVar154._8_8_ = dStack_510 * dVar121;
          auVar84 = divpd(auVar154,_DAT_00fc5630);
          auVar177._0_8_ = local_528 * dVar121;
          auVar177._8_8_ = dStack_520 * dVar121;
          auVar127 = divpd(auVar177,_DAT_00fc5640);
          auVar155._0_8_ = auVar85._0_8_ * dVar121;
          auVar155._8_8_ = auVar85._8_8_ * dVar121;
          auVar162 = divpd(auVar155,_DAT_00fc5650);
          auVar200._0_8_ = local_508 * dVar121;
          auVar200._8_8_ = dStack_500 * dVar121;
          auVar122 = divpd(auVar200,_DAT_00fc5660);
          auVar178._0_8_ = auVar144._0_8_ * dVar121;
          auVar178._8_8_ = auVar144._8_8_ * dVar121;
          auVar144 = divpd(auVar178,_DAT_00fc5670);
          dVar56 = auVar144._0_8_ +
                   auVar122._0_8_ +
                   auVar162._0_8_ +
                   auVar127._0_8_ +
                   auVar84._0_8_ +
                   auVar111._0_8_ +
                   (1.0 / auVar41._8_8_) * dVar121 * -3.0438311688311688e-05 +
                   ((1.0 / auVar41._0_8_) * dVar121) / 1920.0 +
                   dVar157 * dVar121 + auVar206._8_8_ + auVar206._0_8_;
          dVar97 = auVar144._8_8_ +
                   auVar122._8_8_ +
                   auVar162._8_8_ +
                   auVar127._8_8_ +
                   auVar84._8_8_ +
                   auVar111._8_8_ +
                   (((auVar125._0_8_ - auVar125._8_8_) + auVar223._0_8_) - auVar223._8_8_) +
                   ((dVar195 / auVar168._0_8_) * dVar121) / 8.121312287389663e+33;
        }
        if (dVar14 < 0.32) {
          dVar9 = (double)(~uVar8 & (ulong)dVar9);
          dVar10 = dVar10 * 1.1428571428571428 *
                   ((dVar211 * dVar28 * dVar9 +
                    dVar59 * (dVar180 * dVar9 * 30720.0 +
                             dVar10 * dVar9 * 448.0 + dVar203 * dVar9 * -5760.0) +
                    dVar137 * dVar9 +
                    dVar221 * dVar27 * dVar9 * 0.5 +
                    (dVar181 * dVar9 * 26880.0 +
                    dVar196 * dVar9 * -2880.0 +
                    dVar82 * dVar9 * 768.0 + dVar9 * -1105920.0 * dVar58 + dVar9 * -8.0) * dVar27) -
                   dVar26 * dVar158 * dVar9);
          dVar57 = dVar9 * 1.1428571428571428 * dVar57;
        }
        else {
          dVar9 = (double)(uVar8 & (ulong)dVar9);
          auVar133._0_8_ = local_248 * dVar9;
          auVar133._8_8_ = dStack_240 * dVar9;
          auVar162 = divpd(auVar133,_DAT_00fc5680);
          auVar201._0_8_ = auVar198._0_8_ * dVar9;
          auVar201._8_8_ = auVar198._8_8_ * dVar9;
          auVar127 = divpd(auVar201,_DAT_00fc5690);
          auVar71._0_8_ = auVar106._0_8_ * dVar9;
          auVar71._8_8_ = auVar106._8_8_ * dVar9;
          auVar84 = divpd(auVar71,_DAT_00fc56a0);
          auVar134._0_8_ = auVar164._0_8_ * dVar9;
          auVar134._8_8_ = auVar164._8_8_ * dVar9;
          auVar223 = divpd(auVar134,_DAT_00fc56b0);
          auVar156._0_8_ = auVar145._0_8_ * dVar9;
          auVar156._8_8_ = auVar145._8_8_ * dVar9;
          auVar144 = divpd(auVar156,_DAT_00fc56c0);
          auVar135._0_8_ = local_488 * dVar9;
          auVar135._8_8_ = dStack_480 * dVar9;
          auVar111 = divpd(auVar135,_DAT_00fc56d0);
          dVar10 = auVar111._0_8_;
          dVar57 = (((((((((((((1.0 / auVar170._0_8_) * dVar9) / 8272281600.0 +
                             ((1.0 / auVar170._8_8_) * dVar9) / -210862080.0 +
                             ((1.0 / auVar43._0_8_) * dVar9) / 6150144.0 +
                             (1.0 / auVar43._8_8_) * dVar9 * -4.6972703222703225e-06 +
                             dVar204 * dVar9 + ((1.0 / auVar150._0_8_) * dVar9) / 9408.0) -
                            auVar162._8_8_) + auVar162._0_8_) - auVar127._8_8_) + auVar127._0_8_) -
                        auVar84._8_8_) + auVar84._0_8_) - auVar223._8_8_) + auVar223._0_8_) -
                    auVar144._8_8_) + auVar144._0_8_) - auVar111._8_8_;
        }
        dVar9 = 0.0;
        if (dVar83 < dVar29) {
          dVar9 = (dVar143 * dVar12 + dVar143 * dVar12 + dVar12 * dVar48 * 9.0) * dVar21;
          dVar121 = dVar20 * 6.0 * dVar12 * dVar48 - dVar9;
          dVar14 = dVar94 * 1.5874010519681996 * dVar75;
          dVar14 = dVar105 * dVar12 +
                   dVar12 * dVar139 * -1.0814814814814815 * dVar140 +
                   dVar143 * dVar75 * dVar72 * 1.5874010519681996 * dVar140 * 0.003755144032921811 +
                   dVar139 * 1.8171205928321397 * dVar14 * -0.005006858710562414 +
                   dVar76 * 0.002381496723060509 + dVar104 * 0.4166666666666667 * dVar14;
          dVar9 = ((dVar14 * dVar16) / 10.0 +
                  dVar121 * dVar98 +
                  (dVar102 * dVar46 +
                  dVar72 * 0.04460577520576132 * dVar74 * dVar95 + (dVar60 * dVar46) / 5.0) * dVar79
                  + dVar12 * dVar103 * dVar101 +
                    (dVar9 * dVar120 -
                    ((dVar14 * dVar33 * dVar61) / 10.0 +
                    dVar121 * dVar118 * dVar98 +
                    (dVar212 * dVar209 * dVar46 * dVar74 +
                    dVar30 * dVar74 * dVar95 +
                    (dVar57 + dVar10) * 1.8171205928321397 * dVar94 * 0.026329605555555555 * dVar117
                    + dVar215 * dVar94 * dVar209 * dVar46 +
                      dVar75 * dVar116 * 1.5874010519681996 * 0.018276169650205763 * dVar22 +
                      dVar100 * (dVar97 + dVar56) * 0.43209876543209874 * dVar22 +
                      (dVar18 + dVar15) * dVar80 + (local_798 * dVar46) / -5.0) * dVar79 +
                    dVar9 * dVar31 + dVar12 * dVar49 * dVar101) * p->cam_beta)) * dVar50;
        }
        pdVar2 = out->vsigma;
        if ((pdVar2 != (double *)0x0) && ((p->info->flags & 2) != 0)) {
          lVar4 = (long)(p->dim).vsigma * sVar5;
          pdVar2[lVar4] = dVar9 * dVar11 + pdVar2[lVar4];
        }
        pdVar2 = out->vlapl;
        if ((pdVar2 != (double *)0x0) && ((~p->info->flags & 0x8002U) == 0)) {
          lVar4 = (long)(p->dim).vlapl * sVar5;
          pdVar2[lVar4] = pdVar2[lVar4] + 0.0;
        }
        dVar9 = 0.0;
        dVar10 = 0.0;
        if (dVar47 < 1.0) {
          dVar10 = (1.0 / (local_868 * local_868)) * dVar13 * -0.125;
        }
        if (dVar83 < dVar29) {
          dVar21 = dVar21 * (dVar143 * dVar10 + dVar143 * dVar10 + dVar48 * dVar10 * 9.0);
          dVar83 = dVar94 * dVar95 * dVar81 * 1.8171205928321397;
          dVar9 = dVar48 * dVar10 * 6.0 * dVar20 - dVar21;
          dVar143 = dVar105 * dVar10 +
                    dVar139 * dVar10 * -1.0814814814814815 * dVar140 +
                    dVar143 * dVar94 *
                    dVar81 * 1.5874010519681996 * 1.8171205928321397 * -0.27037037037037037 *
                    dVar140 + dVar81 * 1.8171205928321397 * dVar94 *
                              dVar139 * 0.36049382716049383 * 1.5874010519681996;
          dVar9 = dVar50 * ((dVar16 * dVar143) / 10.0 +
                           dVar9 * dVar98 +
                           dVar83 * dVar79 * 1.5874010519681996 * -0.06288822469135802 +
                           dVar103 * dVar10 * dVar101 +
                           (dVar120 * dVar21 -
                           ((dVar61 * dVar33 * dVar143) / 10.0 +
                           dVar118 * dVar9 * dVar98 +
                           dVar116 * 1.5874010519681996 * dVar79 * -0.06288822469135802 * dVar83 +
                           dVar31 * dVar21 + dVar49 * dVar10 * dVar101) * p->cam_beta));
        }
        pdVar2 = out->vtau;
        if ((pdVar2 != (double *)0x0) && ((~p->info->flags & 0x10002U) == 0)) {
          lVar4 = (long)(p->dim).vtau * sVar5;
          pdVar2[lVar4] = dVar11 * dVar9 + pdVar2[lVar4];
        }
      }
      sVar5 = sVar5 + 1;
    } while (np != sVar5);
  }
  return;
}

Assistant:

static void
WORK_MGGA(ORDER_TXT, SPIN_TXT)
(const XC(func_type) *p, size_t np,
 const double *rho, const double *sigma, const double *lapl, const double *tau,
 xc_mgga_out_params *out)
{

#ifdef XC_DEBUG
  /* This throws an exception when floating point errors are encountered */
  //feenableexcept(FE_DIVBYZERO | FE_INVALID | FE_OVERFLOW);
#endif

  size_t ip;
  double dens;
  double my_rho[2]={0.0, 0.0};
  double my_sigma[3]={0.0, 0.0, 0.0};
  double my_tau[2]={0.0, 0.0};

  for(ip = 0; ip < np; ip++){
    /* Screen low density */
    dens = (p->nspin == XC_POLARIZED) ? VAR(rho, ip, 0) + VAR(rho, ip, 1) : VAR(rho, ip, 0);
    if(dens < p->dens_threshold)
      continue;

    /* sanity check of input parameters */
    my_rho[0] = m_max(p->dens_threshold, VAR(rho, ip, 0));
    my_sigma[0] = m_max(p->sigma_threshold * p->sigma_threshold, VAR(sigma, ip, 0));

    /* Many functionals shamelessly divide by tau, so we set a reasonable threshold */
    /* skip all checks on tau for the kinetic functionals */
    if(p->info->flags & XC_FLAGS_NEEDS_TAU){
      my_tau[0] = m_max(p->tau_threshold, VAR(tau, ip, 0));
      if(p->info->flags & XC_FLAGS_ENFORCE_FHC) {
        /* The Fermi hole curvature 1 - xs^2/(8*ts) must be positive */
        my_sigma[0] = m_min(my_sigma[0], 8.0*my_rho[0]*my_tau[0]);
      }
    }
    /* lapl can have any values */

    if(p->nspin == XC_POLARIZED){
      double s_ave;

      my_rho[1] = m_max(p->dens_threshold, VAR(rho, ip, 1));
      my_sigma[2] = m_max(p->sigma_threshold * p->sigma_threshold, VAR(sigma, ip, 2));

      if(p->info->flags & XC_FLAGS_NEEDS_TAU){
        my_tau[1] = m_max(p->tau_threshold, VAR(tau, ip, 1));
        if(p->info->flags & XC_FLAGS_ENFORCE_FHC) {
          /* The Fermi hole curvature 1 - xs^2/(8*ts) must be positive */
          my_sigma[2] = m_min(my_sigma[2], 8.0*my_rho[1]*my_tau[1]);
        }
      }
      
      my_sigma[1] = VAR(sigma, ip, 1);
      s_ave = 0.5*(my_sigma[0] + my_sigma[2]);
      /* | grad n |^2 = |grad n_up + grad n_down|^2 > 0 */
      my_sigma[1] = (my_sigma[1] >= -s_ave ? my_sigma[1] : -s_ave);
      /* Since |grad n_up - grad n_down|^2 > 0 we also have */
      my_sigma[1] = (my_sigma[1] <= +s_ave ? my_sigma[1] : +s_ave);
    }

    FUNC(ORDER_TXT, SPIN_TXT)(p, ip, my_rho, my_sigma, &VAR(lapl, ip, 0), my_tau, out);

    /* check for NaNs */
#ifdef XC_DEBUG
    {
      const xc_dimensions *dim = &(p->dim);
      int ii, is_OK = 1;

      if(out->zk != NULL)
        is_OK = is_OK & isfinite(out->VAR(zk, ip, 0));

      if(out->vrho != NULL){
        for(ii=0; ii < dim->vrho; ii++)
          is_OK = is_OK && isfinite(out->VAR(vrho, ip, ii));
        for(ii=0; ii < dim->vsigma; ii++)
          is_OK = is_OK && isfinite(out->VAR(vsigma, ip, ii));
        if(p->info->flags & XC_FLAGS_NEEDS_LAPLACIAN)
          for(ii=0; ii < dim->vlapl; ii++)
            is_OK = is_OK && isfinite(out->VAR(vlapl, ip, ii));
        if(p->info->flags & XC_FLAGS_NEEDS_TAU)
          for(ii=0; ii < dim->vtau; ii++)
            is_OK = is_OK && isfinite(out->VAR(vtau, ip, ii));
      }

      if(!is_OK){
        printf("Problem in the evaluation of the functional\n");
        if(p->nspin == XC_UNPOLARIZED){
          printf("./xc-get_data %d 1 ", p->info->number);
          if(p->info->flags & (XC_FLAGS_NEEDS_LAPLACIAN | XC_FLAGS_NEEDS_TAU))
            printf("%le 0.0 %le 0.0 0.0 %le 0.0 %le 0.0\n",
                   VAR(rho, ip, 0), VAR(sigma, ip, 0), VAR(lapl, ip, 0), VAR(tau, ip, 0));
          else if(p->info->flags & XC_FLAGS_NEEDS_LAPLACIAN)
            printf("%le 0.0 %le 0.0 0.0 %le 0.0 0.0 0.0\n",
                   VAR(rho, ip, 0), VAR(sigma, ip, 0), VAR(lapl, ip, 0));
          else
            printf("%le 0.0 %le 0.0 0.0 0.0 0.0 %le 0.0\n",
                   VAR(rho, ip, 0), VAR(sigma, ip, 0), VAR(tau, ip, 0));
        }else{
          printf("./xc-get_data %d 2 ", p->info->number);
          if(p->info->flags & (XC_FLAGS_NEEDS_LAPLACIAN | XC_FLAGS_NEEDS_TAU))
            printf("%le %le %le %le %le %le %le %le %le\n",
                   VAR(rho, ip, 0), VAR(rho, ip, 1),
                   VAR(sigma, ip, 0), VAR(sigma, ip, 1), VAR(sigma, ip, 2),
                   VAR(lapl, ip, 0), VAR(lapl, ip, 1),
                   VAR(tau, ip, 0), VAR(tau, ip, 1));
          else if(p->info->flags & XC_FLAGS_NEEDS_LAPLACIAN)
            printf("%le %le %le %le %le %le %le 0.0 0.0\n",
                   VAR(rho, ip, 0), VAR(rho, ip, 1),
                   VAR(sigma, ip, 0), VAR(sigma, ip, 1), VAR(sigma, ip, 2),
                   VAR(lapl, ip, 0), VAR(lapl, ip, 1));
          else
            printf("%le %le %le %le %le 0.0 0.0 %le %le\n",
                   VAR(rho, ip, 0), VAR(rho, ip, 1),
                   VAR(sigma, ip, 0), VAR(sigma, ip, 1), VAR(sigma, ip, 2),
                   VAR(tau, ip, 0), VAR(tau, ip, 1));
        }
      }
    }
#endif
  }   /* for(ip) */

}